

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

date_t duckdb::TimeBucket::OffsetWidthConvertibleToMonthsTernaryOperator::
       Operation<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t>
                 (interval_t bucket_width,date_t ts,interval_t offset)

{
  interval_t iVar1;
  interval_t iVar2;
  bool bVar3;
  date_t dVar4;
  undefined8 in_RCX;
  date_t in_EDX;
  int64_t in_R8;
  int32_t ts_months;
  date_t in_stack_ffffffffffffff84;
  int32_t in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  int32_t in_stack_ffffffffffffff90;
  date_t in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  bVar3 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDX);
  if (bVar3) {
    iVar1.micros = in_R8;
    iVar1._0_8_ = in_RCX;
    iVar2 = (interval_t)duckdb::Interval::Invert(iVar1);
    dVar4.days = duckdb::Interval::Add(in_EDX,iVar2);
    EpochMonths<duckdb::date_t>(in_stack_ffffffffffffff84);
    WidthConvertibleToMonthsCommon
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    dVar4 = Cast::Operation<duckdb::date_t,duckdb::date_t>(dVar4);
    iVar2.micros._0_4_ = (int)in_R8;
    iVar2._0_8_ = in_RCX;
    iVar2.micros._4_4_ = (int)((ulong)in_R8 >> 0x20);
    local_4 = duckdb::Interval::Add(dVar4,iVar2);
  }
  else {
    local_4 = Cast::Operation<duckdb::date_t,duckdb::date_t>(in_stack_ffffffffffffffc0);
  }
  return (date_t)local_4;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts, TC offset) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int32_t ts_months = EpochMonths(Interval::Add(ts, Interval::Invert(offset)));
			return Interval::Add(Cast::template Operation<date_t, TR>(WidthConvertibleToMonthsCommon(
			                         bucket_width.months, ts_months, DEFAULT_ORIGIN_MONTHS)),
			                     offset);
		}